

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O3

TimerTickResult __thiscall tonk::Connection::onDiscoTimerTick(Connection *this)

{
  HostnameResolverState *pHVar1;
  tuple<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
  tVar2;
  TimerTickResult TVar3;
  
  pHVar1 = (this->ResolverState)._M_t.
           super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
           ._M_t.
           super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
           .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl;
  if ((pHVar1 != (HostnameResolverState *)0x0) &&
     (tVar2.
      super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
      .
      super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
      ._M_head_impl =
           *(_Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
             *)&(pHVar1->Resolver)._M_t.
                super___uniq_ptr_impl<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
     , tVar2.
       super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
       .
       super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
       ._M_head_impl !=
       (_Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
        )0x0)) {
    std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::
    reset<void,asio::detail::socket_ops::noop_deleter>
              ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)
               ((long)tVar2.
                      super__Tuple_impl<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_std::default_delete<asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_>_>
                      .
                      super__Head_base<0UL,_asio::ip::basic_resolver<asio::ip::tcp,_asio::ip::resolver_service<asio::ip::tcp>_>_*,_false>
                      ._M_head_impl + 8),0);
  }
  reportClose(this);
  TVar3 = TickAgain;
  if ((((this->super_IConnection).SelfRefCount.AppHoldsReference._M_base._M_i & 1U) == 0) &&
     (TVar3 = TickAgain,
     (this->super_IConnection).SelfRefCount.RefCount.super___atomic_base<int>._M_i == 0)) {
    Shutdown(this);
    (*(this->super_IConnection)._vptr_IConnection[1])(this);
    TVar3 = StopTicking;
  }
  return TVar3;
}

Assistant:

Connection::TimerTickResult Connection::onDiscoTimerTick()
{
    // Cancel any ongoing hostname resolution to quit faster
    if (ResolverState && ResolverState->Resolver) {
        ResolverState->Resolver->cancel();
    }

    // It is safe to report OnClose() to the application here because all of
    // the strand work will check if disconnection has started before invoking
    // any further callbacks.
    reportClose();

    /*
        The Connection object will stay alive until the application calls
        tonk_free().  After that point this code will run periodically to
        check if it is time to free the Connection object.  Note that since
        this code is running in the Connection's strand, it is not possible
        for datagram processing (or other operations) to be going on in
        parallel.  And the application has called tonk_free() to promise
        that no more API calls will interact with the object.

        Summary- In the Connection strand:
        (1) Datagram may be pending to process
        (2) Flush may be queued
        (3) async_resolve() may be in progress

        Summary- In the Send() completion callback:
        (4) Connection::WriteAllocator.Free() from Send() completion


        Drilling into each one:

        (1) Datagram may be pending to process

        This will continue to happen until the Connection is removed from all
        of the ConnectionMaps.  After that point incoming datagrams will stop
        being assigned to this Connection.  Some may still be pending for
        processing directly after this timer tick.

        (2) Flush may be queued.

        Flush gets queued when the app calls tonk_flush(), which may happen
        immediately after this timer tick.

        (3) async_resolve() may be in progress

        Initiated connections will resolve the server hostname before sending
        the first datagram.  If the application calls tonk_close() followed by
        tonk_free() during this operation, then we should wait for it to
        complete before shutting down.

        (4) Connection::WriteAllocator.Free() from Send() completion

        Since the application is no longer sending datagrams and this timer tick
        does not cause any new datagrams to be sent, there may be some pending
        Send() callbacks that will not complete until after this timer tick.


        Design:

        A reference count in the Connection class is incremented before queuing
        all operations.  When the operation completes, the counter is decremented
        before the completion callback returns.  It is important to pay close
        attention to the lifetime of scoped objects like Locker to make sure that
        the counter is decremented after these objects go out of scope.

        This timer tick will be able to delete the object after the reference
        counter goes to zero.

        In practice this means that any asio async operation e.g.
            ->post(
        Or
            ->async_resolve(
        Or
            ->async_send_to(
        Must have all code paths covered with reference counting.
    */

    if (SelfRefCount.ObjectInUse()) {
        //Logger.Debug("Delaying Connection shutdown (object in use)");
        return TimerTickResult::TickAgain;
    }

    Shutdown();

    // Object goes out of scope here----------------------------------------
    delete this;

    return TimerTickResult::StopTicking;
}